

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O2

void __thiscall JsrtDebugManager::DbgRegisterFunction(JsrtDebugManager *this)

{
  DWORD_PTR in_RCX;
  FunctionBody *in_RDX;
  ScriptContext *in_RSI;
  LPCWSTR in_R8;
  
  DbgRegisterFunction((JsrtDebugManager *)&this[-1].stackFrames,in_RSI,in_RDX,in_RCX,in_R8);
  return;
}

Assistant:

HRESULT JsrtDebugManager::DbgRegisterFunction(Js::ScriptContext* scriptContext, Js::FunctionBody* functionBody, DWORD_PTR dwDebugSourceContext, LPCWSTR title)
{
    Js::Utf8SourceInfo* utf8SourceInfo = functionBody->GetUtf8SourceInfo();

    if (!utf8SourceInfo->GetIsLibraryCode() && !utf8SourceInfo->HasDebugDocument())
    {
        JsrtDebugDocumentManager* debugDocumentManager = this->GetDebugDocumentManager();
        Assert(debugDocumentManager != nullptr);

        Js::DebugDocument* debugDocument = HeapNewNoThrow(Js::DebugDocument, utf8SourceInfo, functionBody);
        if (debugDocument != nullptr)
        {
            utf8SourceInfo->SetDebugDocument(debugDocument);
        }

        // Raising events during the middle of a source reparse allows the host to reenter the
        // script context and cause memory race conditions. Suppressing these events during a
        // reparse prevents the issue. Since the host was already expected to call JsDiagGetScripts
        // once the attach is completed to get the list of parsed scripts, there is no change in
        // behavior.
        if (this->debugEventCallback != nullptr &&
            !scriptContext->GetDebugContext()->GetIsReparsingSource())
        {
            JsrtDebugEventObject debugEventObject(scriptContext);
            Js::DynamicObject* eventDataObject = debugEventObject.GetEventDataObject();
            JsrtDebugUtils::AddSourceMetadataToObject(eventDataObject, utf8SourceInfo);

            this->CallDebugEventCallback(JsDiagDebugEventSourceCompile, eventDataObject, scriptContext, false /*isBreak*/);
        }
    }

    return S_OK;
}